

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

prof_tdata_t * duckdb_je_prof_tdata_init(tsd_t *tsd)

{
  uint64_t tdata;
  int iVar1;
  prof_tdata_t *extraout_RAX;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&next_thr_uid_mtx.field_0 + 0x48));
  if (iVar1 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&next_thr_uid_mtx);
  }
  tdata = next_thr_uid;
  next_thr_uid_mtx.field_0.field_0.prof_data.n_lock_ops =
       next_thr_uid_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(next_thr_uid_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    next_thr_uid_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(next_thr_uid_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    next_thr_uid_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  next_thr_uid = next_thr_uid + 1;
  next_thr_uid_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&next_thr_uid_mtx.field_0 + 0x48));
  duckdb_je_prof_thread_active_init_get((tsdn_t *)tsd);
  duckdb_je_prof_tdata_detach(tsd,(prof_tdata_t *)tdata);
  return extraout_RAX;
}

Assistant:

prof_tdata_t *
prof_tdata_init(tsd_t *tsd) {
	return prof_tdata_init_impl(tsd, prof_thr_uid_alloc(tsd_tsdn(tsd)), 0,
	    NULL, prof_thread_active_init_get(tsd_tsdn(tsd)));
}